

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

word * Ssc_GiaGetCareMask(Gia_Man_t *p)

{
  int nWords_00;
  int iVar1;
  word *pSim;
  word *pSim1;
  bool bVar2;
  word *pRes;
  int nWords;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  nWords_00 = Gia_ObjSimWords(p);
  pSim = (word *)malloc((long)nWords_00 << 3);
  memset(pSim,0xff,(long)nWords_00 << 3);
  pRes._4_4_ = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar2 = false;
    if (pRes._4_4_ < iVar1) {
      _nWords = Gia_ManCo(p,pRes._4_4_);
      bVar2 = _nWords != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    pSim1 = Gia_ObjSimObj(p,_nWords);
    Ssc_SimAnd(pSim,pSim,pSim1,nWords_00,0,0);
    pRes._4_4_ = pRes._4_4_ + 1;
  }
  return pSim;
}

Assistant:

word * Ssc_GiaGetCareMask( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nWords = Gia_ObjSimWords( p );
    word * pRes = ABC_FALLOC( word, nWords );
    Gia_ManForEachPo( p, pObj, i )
        Ssc_SimAnd( pRes, pRes, Gia_ObjSimObj(p, pObj), nWords, 0, 0 );
    return pRes;
}